

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

bool __thiscall
sf::Shader::loadFromFile(Shader *this,string *vertexShaderFilename,string *fragmentShaderFilename)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RDX;
  string *in_RSI;
  vector<char,_std::allocator<char>_> fragmentShader;
  vector<char,_std::allocator<char>_> vertexShader;
  vector<char,_std::allocator<char>_> *in_stack_00000180;
  string *in_stack_00000188;
  char *in_stack_00001050;
  char *in_stack_00001058;
  char *in_stack_00001060;
  Shader *in_stack_00001068;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  vector<char,_std::allocator<char>_> local_60;
  undefined4 local_48;
  vector<char,_std::allocator<char>_> local_38;
  string *local_20;
  string *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x2c5bfe);
  bVar1 = anon_unknown.dwarf_3b3964::getFileContents(in_stack_00000188,in_stack_00000180);
  if (bVar1) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0x2c5cd5);
    bVar1 = anon_unknown.dwarf_3b3964::getFileContents(in_stack_00000188,in_stack_00000180);
    if (bVar1) {
      std::vector<char,_std::allocator<char>_>::operator[](&local_38,0);
      std::vector<char,_std::allocator<char>_>::operator[](&local_60,0);
      in_stack_ffffffffffffff37 =
           compile(in_stack_00001068,in_stack_00001060,in_stack_00001058,in_stack_00001050);
      local_1 = (bool)in_stack_ffffffffffffff37;
    }
    else {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Failed to open fragment shader file \"");
      poVar2 = std::operator<<(poVar2,local_20);
      poVar2 = std::operator<<(poVar2,"\"");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_1 = false;
    }
    local_48 = 1;
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  }
  else {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to open vertex shader file \"");
    poVar2 = std::operator<<(poVar2,local_18);
    poVar2 = std::operator<<(poVar2,"\"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_1 = false;
    local_48 = 1;
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  return (bool)(local_1 & 1);
}

Assistant:

bool Shader::loadFromFile(const std::string& vertexShaderFilename, const std::string& fragmentShaderFilename)
{
    // Read the vertex shader file
    std::vector<char> vertexShader;
    if (!getFileContents(vertexShaderFilename, vertexShader))
    {
        err() << "Failed to open vertex shader file \"" << vertexShaderFilename << "\"" << std::endl;
        return false;
    }

    // Read the fragment shader file
    std::vector<char> fragmentShader;
    if (!getFileContents(fragmentShaderFilename, fragmentShader))
    {
        err() << "Failed to open fragment shader file \"" << fragmentShaderFilename << "\"" << std::endl;
        return false;
    }

    // Compile the shader program
    return compile(&vertexShader[0], NULL, &fragmentShader[0]);
}